

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_complex_asin(sexp ctx,sexp z)

{
  sexp psVar1;
  sexp psVar2;
  sexp psVar3;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp tmp2;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp_conflict *local_58;
  sexp image;
  sexp real;
  undefined8 n;
  undefined8 z_00;
  
  memset(&stack0xffffffffffffffd8,0,0x10);
  memset(&stack0xffffffffffffffc0,0,0x10);
  real = (sexp)&DAT_0000043e;
  memset(&local_58,0,0x10);
  n = &stack0xffffffffffffffe8;
  z_00 = (((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffd8;
  psVar3 = (sexp)&stack0xffffffffffffffd0;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffc0;
  local_58 = (sexp_conflict *)&stack0xffffffffffffffb8;
  image = (sexp)(((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&local_58;
  sexp_complex_mul((sexp)__sexp_gc_preserver3.var,(sexp)in_RDI,(sexp)in_RSI);
  psVar1 = sexp_sub(ctx,z,res);
  sexp_sqrt((sexp)in_RDI,(sexp)in_RSI,(sexp_sint_t)psVar1,(sexp)z_00);
  psVar1 = sexp_make_complex(psVar3,real,image);
  psVar2 = sexp_mul(res,(sexp)__sexp_gc_preserver1.next,(sexp)__sexp_gc_preserver1.var);
  (psVar1->value).type.name = psVar2;
  (psVar1->value).type.cpl =
       (sexp)((anon_union_24768_35_b8e82fc1_for_value *)&((FILE *)in_RSI)->_IO_read_ptr)->flonum;
  psVar2 = sexp_add((sexp)__sexp_gc_preserver1.var,tmp,(sexp)__sexp_gc_preserver2.next);
  sexp_log(psVar2,(sexp)z_00,n,psVar1);
  sexp_make_complex(psVar3,real,image);
  psVar3 = sexp_mul(res,(sexp)__sexp_gc_preserver1.next,(sexp)__sexp_gc_preserver1.var);
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)z_00;
  return psVar3;
}

Assistant:

sexp sexp_complex_asin (sexp ctx, sexp z) {
  sexp_gc_var3(res, tmp, tmp2);
  sexp_gc_preserve3(ctx, res, tmp, tmp2);
  res = sexp_complex_mul(ctx, z, z);
  res = sexp_sub(ctx, SEXP_ONE, res);
  res = sexp_sqrt(ctx, NULL, 1, res);
  tmp = sexp_make_complex(ctx, SEXP_ZERO, SEXP_ZERO);
  sexp_complex_real(tmp) = sexp_mul(ctx, SEXP_NEG_ONE, sexp_complex_imag(z));
  sexp_complex_imag(tmp) = sexp_complex_real(z);
  res = sexp_add(ctx, tmp, res);
  res = sexp_log(ctx, NULL, 1, res);
  tmp = sexp_make_complex(ctx, SEXP_ZERO, SEXP_NEG_ONE);
  res = sexp_mul(ctx, res, tmp);
  sexp_gc_release3(ctx);
  return res;
}